

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  char *pcVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  undefined8 *puVar4;
  size_t sVar5;
  key_type *__k;
  void *local_38;
  
  __k = (key_type *)file;
  local_38 = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  pmVar3 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                         *)&local_38,__k);
  if (pmVar3->first_used_file == (char *)0x0) {
    pmVar3->first_used_file = file;
    pmVar3->first_used_line = line;
    testing::UnitTest::GetInstance();
    puVar4 = (undefined8 *)testing::UnitTest::current_test_info();
    if (puVar4 != (undefined8 *)0x0) {
      pcVar1 = (char *)*puVar4;
      sVar2 = (pmVar3->first_used_test_suite)._M_string_length;
      sVar5 = strlen(pcVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&pmVar3->first_used_test_suite,0,sVar2,pcVar1,sVar5);
      pcVar1 = (char *)puVar4[4];
      sVar2 = (pmVar3->first_used_test)._M_string_length;
      sVar5 = strlen(pcVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&pmVar3->first_used_test,0,sVar2,pcVar1,sVar5);
    }
  }
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == nullptr) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != nullptr) {
      state.first_used_test_suite = test_info->test_suite_name();
      state.first_used_test = test_info->name();
    }
  }
}